

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallGenerator.cxx
# Opt level: O0

MessageLevel cmInstallGenerator::SelectMessageLevel(cmMakefile *mf,bool never)

{
  bool bVar1;
  string *psVar2;
  allocator<char> local_61;
  string local_60;
  undefined1 local_40 [8];
  string m;
  bool never_local;
  cmMakefile *mf_local;
  
  if (never) {
    mf_local._4_4_ = MessageNever;
  }
  else {
    m.field_2._M_local_buf[0xf] = never;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_60,"CMAKE_INSTALL_MESSAGE",&local_61);
    psVar2 = cmMakefile::GetSafeDefinition(mf,&local_60);
    std::__cxx11::string::string((string *)local_40,(string *)psVar2);
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator(&local_61);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_40,"ALWAYS");
    if (bVar1) {
      mf_local._4_4_ = MessageAlways;
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_40,"LAZY");
      if (bVar1) {
        mf_local._4_4_ = MessageLazy;
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_40,"NEVER");
        if (bVar1) {
          mf_local._4_4_ = MessageNever;
        }
        else {
          mf_local._4_4_ = MessageDefault;
        }
      }
    }
    std::__cxx11::string::~string((string *)local_40);
  }
  return mf_local._4_4_;
}

Assistant:

cmInstallGenerator::MessageLevel cmInstallGenerator::SelectMessageLevel(
  cmMakefile* mf, bool never)
{
  if (never) {
    return MessageNever;
  }
  std::string m = mf->GetSafeDefinition("CMAKE_INSTALL_MESSAGE");
  if (m == "ALWAYS") {
    return MessageAlways;
  }
  if (m == "LAZY") {
    return MessageLazy;
  }
  if (m == "NEVER") {
    return MessageNever;
  }
  return MessageDefault;
}